

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::fillWithRandomColorTiles
               (PixelBufferAccess *dst,Vec4 *minVal,Vec4 *maxVal,deUint32 seed)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int y;
  int i;
  int iVar10;
  long lVar11;
  int iVar12;
  int z;
  float fVar13;
  Vec4 color;
  Random rnd;
  PixelBufferAccess local_58;
  
  iVar12 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
  iVar5 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
  iVar10 = 7;
  if (iVar12 < 7) {
    iVar10 = iVar12;
  }
  iVar12 = 5;
  if (iVar5 < 5) {
    iVar12 = iVar5;
  }
  deRandom_init(&rnd.m_rnd,seed);
  iVar5 = 0;
  if (0 < iVar10) {
    iVar5 = iVar10;
  }
  iVar6 = 0;
  if (0 < iVar12) {
    iVar6 = iVar12;
  }
  for (z = 0; z < (dst->super_ConstPixelBufferAccess).m_size.m_data[2]; z = z + 1) {
    iVar3 = 0;
    while (iVar7 = iVar3, iVar7 != iVar6) {
      iVar9 = 0;
      while (iVar3 = iVar7 + 1, iVar9 != iVar5) {
        iVar3 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
        iVar4 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
        iVar8 = iVar3 * iVar9;
        iVar9 = iVar9 + 1;
        tcu::Vector<float,_4>::Vector(&color);
        for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
          fVar1 = minVal->m_data[lVar11];
          fVar2 = maxVal->m_data[lVar11];
          fVar13 = deRandom_getFloat(&rnd.m_rnd);
          color.m_data[lVar11] = fVar13 * (fVar2 - fVar1) + fVar1;
        }
        y = (iVar4 * iVar7) / iVar12;
        iVar8 = iVar8 / iVar10;
        tcu::getSubregion(&local_58,dst,iVar8,y,z,(iVar3 * iVar9) / iVar10 - iVar8,
                          (iVar4 * (iVar7 + 1)) / iVar12 - y,1);
        tcu::clear(&local_58,&color);
      }
    }
  }
  return;
}

Assistant:

static void fillWithRandomColorTiles (const PixelBufferAccess& dst, const Vec4& minVal, const Vec4& maxVal, deUint32 seed)
{
	const int	numCols		= dst.getWidth()  >= 7 ? 7 : dst.getWidth();
	const int	numRows		= dst.getHeight() >= 5 ? 5 : dst.getHeight();
	de::Random	rnd			(seed);

	for (int slice = 0; slice < dst.getDepth(); slice++)
	for (int row = 0; row < numRows; row++)
	for (int col = 0; col < numCols; col++)
	{
		const int	yBegin	= (row+0)*dst.getHeight()/numRows;
		const int	yEnd	= (row+1)*dst.getHeight()/numRows;
		const int	xBegin	= (col+0)*dst.getWidth()/numCols;
		const int	xEnd	= (col+1)*dst.getWidth()/numCols;
		Vec4		color;
		for (int i = 0; i < 4; i++)
			color[i] = rnd.getFloat(minVal[i], maxVal[i]);
		tcu::clear(tcu::getSubregion(dst, xBegin, yBegin, slice, xEnd-xBegin, yEnd-yBegin, 1), color);
	}
}